

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool anon_unknown.dwarf_172c5::extract_tar(char *outFileName,bool verbose,bool extract)

{
  FILE *__stream;
  archive_entry *entry_00;
  wchar_t wVar1;
  uint uVar2;
  mode_t mVar3;
  int iVar4;
  archive *a;
  archive *_a;
  char *pcVar5;
  string *__s;
  int64_t iVar6;
  size_t sVar7;
  dev_t dVar8;
  dev_t dVar9;
  tm *__tp;
  ssize_t sVar10;
  char *cstr;
  undefined7 in_register_00000031;
  char *__format;
  bool bVar11;
  archive_entry *entry;
  time_t tim;
  undefined4 local_cc;
  size_t local_c8;
  cmLocaleRAII localeRAII;
  char tmp [100];
  size_t size;
  
  local_cc = (undefined4)CONCAT71(in_register_00000031,verbose);
  cmLocaleRAII::cmLocaleRAII(&localeRAII);
  a = archive_read_new();
  _a = archive_write_disk_new();
  archive_read_support_compression_all(a);
  archive_read_support_format_all(a);
  cmsys::Encoding::ToWide_abi_cxx11_((wstring *)tmp,(Encoding *)outFileName,cstr);
  wVar1 = archive_read_open_filename_w(a,(wchar_t *)tmp._0_8_,0x2800);
  std::__cxx11::wstring::~wstring((wstring *)tmp);
  if (wVar1 == L'\0') {
LAB_0012b7af:
    do {
      wVar1 = archive_read_next_header(a,&entry);
      entry_00 = entry;
      __stream = _stdout;
      if (wVar1 != L'\0') {
        if (wVar1 != L'\x01') {
          pcVar5 = archive_error_string(a);
          cmSystemTools::Error
                    ("Problem with archive_read_next_header(): ",pcVar5,(char *)0x0,(char *)0x0);
        }
        goto LAB_0012bc29;
      }
      if ((char)local_cc == '\0') {
        if (!extract) {
          cm_archive_entry_pathname_abi_cxx11_((string *)tmp,entry);
          cmSystemTools::Stdout((char *)tmp._0_8_);
          std::__cxx11::string::~string((string *)tmp);
          cmSystemTools::Stdout("\n");
          goto LAB_0012b7af;
        }
      }
      else {
        if (extract) {
          cmSystemTools::Stdout("x ");
          cm_archive_entry_pathname_abi_cxx11_((string *)tmp,entry);
          cmSystemTools::Stdout((char *)tmp._0_8_);
          std::__cxx11::string::~string((string *)tmp);
        }
        else {
          if ((anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now == 0) {
            time(&(anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now);
          }
          pcVar5 = archive_entry_strmode((archive_entry_conflict *)entry_00);
          uVar2 = archive_entry_nlink(entry_00);
          fprintf(__stream,"%s %d ",pcVar5,(ulong)uVar2);
          __s = (string *)archive_entry_uname(entry_00);
          if ((__s == (string *)0x0) || (*(char *)&(__s->_M_dataplus)._M_p == '\0')) {
            iVar6 = archive_entry_uid(entry_00);
            sprintf(tmp,"%lu ",iVar6);
            __s = (string *)tmp;
          }
          sVar7 = strlen((char *)__s);
          if (sVar7 < 7) {
            sVar7 = 6;
          }
          fprintf(__stream,"%-*s ",sVar7 & 0xffffffff,__s);
          pcVar5 = archive_entry_gname(entry_00);
          if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
            iVar6 = archive_entry_gid(entry_00);
            sprintf(tmp,"%lu",iVar6);
            local_c8 = strlen(tmp);
            fputs(tmp,__stream);
          }
          else {
            fputs(pcVar5,__stream);
            local_c8 = strlen(pcVar5);
          }
          mVar3 = archive_entry_filetype(entry_00);
          if (mVar3 == 0x2000) {
LAB_0012b97c:
            dVar8 = archive_entry_rdevmajor(entry_00);
            dVar9 = archive_entry_rdevminor(entry_00);
            sprintf(tmp,"%lu,%lu",dVar8,dVar9);
          }
          else {
            mVar3 = archive_entry_filetype(entry_00);
            if (mVar3 == 0x6000) goto LAB_0012b97c;
            iVar6 = archive_entry_size(entry_00);
            sprintf(tmp,"%lu",iVar6);
          }
          sVar7 = strlen(tmp);
          iVar4 = (int)(sVar7 + local_c8) + 1;
          if (sVar7 + local_c8 < 0xd) {
            iVar4 = 0xd;
          }
          fprintf(__stream,"%*s",(ulong)(uint)(iVar4 - (int)local_c8),(string *)tmp);
          tim = archive_entry_mtime(entry_00);
          pcVar5 = "%e %b %H:%M";
          if ((anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now + 0xf099c0 <
              tim) {
            pcVar5 = "%e %b  %Y";
          }
          if (tim < (anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now +
                    -0xf099c0) {
            pcVar5 = "%e %b  %Y";
          }
          __tp = localtime(&tim);
          strftime(tmp,100,pcVar5,__tp);
          fprintf(__stream," %s ",(string *)tmp);
          cm_archive_entry_pathname_abi_cxx11_((string *)&size,entry_00);
          fputs((char *)size,__stream);
          std::__cxx11::string::~string((string *)&size);
          pcVar5 = archive_entry_hardlink(entry_00);
          if (pcVar5 == (char *)0x0) {
            pcVar5 = archive_entry_symlink(entry_00);
            if (pcVar5 == (char *)0x0) goto LAB_0012badb;
            pcVar5 = archive_entry_symlink(entry_00);
            __format = " -> %s";
          }
          else {
            pcVar5 = archive_entry_hardlink(entry_00);
            __format = " link to %s";
          }
          fprintf(__stream,__format,pcVar5);
        }
LAB_0012badb:
        cmSystemTools::Stdout("\n");
        if (!extract) goto LAB_0012b7af;
      }
      wVar1 = archive_write_disk_set_options(_a,L'\x04');
      if (wVar1 != L'\0') {
        pcVar5 = archive_error_string(_a);
        cmSystemTools::Error
                  ("Problem with archive_write_disk_set_options(): ",pcVar5,(char *)0x0,(char *)0x0)
        ;
        goto LAB_0012bc29;
      }
      wVar1 = archive_write_header(_a,entry);
      if (wVar1 != L'\0') {
        pcVar5 = archive_error_string(_a);
        cmSystemTools::Error("Problem with archive_write_header(): ",pcVar5,(char *)0x0,(char *)0x0)
        ;
        cm_archive_entry_pathname_abi_cxx11_((string *)tmp,entry);
        cmSystemTools::Error("Current file: ",(char *)tmp._0_8_,(char *)0x0,(char *)0x0);
        std::__cxx11::string::~string((string *)tmp);
        goto LAB_0012bc29;
      }
      do {
        iVar4 = archive_read_data_block(a,(void **)tmp,&size,&tim);
        if (iVar4 != 0) goto LAB_0012bb6b;
        sVar10 = archive_write_data_block(_a,(void *)tmp._0_8_,size,tim);
      } while (sVar10 == 0);
      pcVar5 = archive_error_string(_a);
      cmSystemTools::Message("archive_write_data_block()",pcVar5);
LAB_0012bb6b:
      wVar1 = archive_write_finish_entry(_a);
    } while (wVar1 == L'\0');
    pcVar5 = archive_error_string(_a);
    cmSystemTools::Error
              ("Problem with archive_write_finish_entry(): ",pcVar5,(char *)0x0,(char *)0x0);
LAB_0012bc29:
    archive_write_free(_a);
    archive_read_close(a);
    archive_read_finish(a);
    bVar11 = wVar1 == L'\x01';
  }
  else {
    pcVar5 = archive_error_string(a);
    cmSystemTools::Error("Problem with archive_read_open_file(): ",pcVar5,(char *)0x0,(char *)0x0);
    archive_write_free(_a);
    archive_read_close(a);
    bVar11 = false;
  }
  cmLocaleRAII::~cmLocaleRAII(&localeRAII);
  return bVar11;
}

Assistant:

bool extract_tar(const char* outFileName, bool verbose,
                 bool extract)
{
  cmLocaleRAII localeRAII;
  static_cast<void>(localeRAII);
  struct archive* a = archive_read_new();
  struct archive *ext = archive_write_disk_new();
  archive_read_support_compression_all(a);
  archive_read_support_format_all(a);
  struct archive_entry *entry;
  int r = cm_archive_read_open_file(a, outFileName, 10240);
  if(r)
    {
    cmSystemTools::Error("Problem with archive_read_open_file(): ",
                         archive_error_string(a));
    archive_write_free(ext);
    archive_read_close(a);
    return false;
    }
  for (;;)
    {
    r = archive_read_next_header(a, &entry);
    if (r == ARCHIVE_EOF)
      {
      break;
      }
    if (r != ARCHIVE_OK)
      {
      cmSystemTools::Error("Problem with archive_read_next_header(): ",
                           archive_error_string(a));
      break;
      }
    if(verbose)
      {
      if(extract)
        {
        cmSystemTools::Stdout("x ");
        cmSystemTools::Stdout(cm_archive_entry_pathname(entry).c_str());
        }
      else
        {
        list_item_verbose(stdout, entry);
        }
      cmSystemTools::Stdout("\n");
      }
    else if(!extract)
      {
      cmSystemTools::Stdout(cm_archive_entry_pathname(entry).c_str());
      cmSystemTools::Stdout("\n");
      }
    if(extract)
      {
      r = archive_write_disk_set_options(ext, ARCHIVE_EXTRACT_TIME);
      if (r != ARCHIVE_OK)
        {
        cmSystemTools::Error(
          "Problem with archive_write_disk_set_options(): ",
          archive_error_string(ext));
        break;
        }

      r = archive_write_header(ext, entry);
      if (r == ARCHIVE_OK)
        {
        copy_data(a, ext);
        r = archive_write_finish_entry(ext);
        if (r != ARCHIVE_OK)
          {
          cmSystemTools::Error("Problem with archive_write_finish_entry(): ",
                               archive_error_string(ext));
          break;
          }
        }
#ifdef _WIN32
      else if(const char* linktext = archive_entry_symlink(entry))
        {
        std::cerr << "cmake -E tar: warning: skipping symbolic link \""
                  << cm_archive_entry_pathname(entry)
                  << "\" -> \""
                  << linktext << "\"." << std::endl;
        }
#endif
      else
        {
        cmSystemTools::Error("Problem with archive_write_header(): ",
                             archive_error_string(ext));
        cmSystemTools::Error("Current file: ",
                             cm_archive_entry_pathname(entry).c_str());
        break;
        }
      }
    }